

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

size_t quantize_iq2_xs(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  long in_RCX;
  long in_RDX;
  int64_t row;
  char *qrow;
  int64_t nblock;
  float *in_stack_000002c8;
  int64_t in_stack_000002d0;
  void *in_stack_000002d8;
  float *in_stack_000002e0;
  long local_40;
  
  if (in_RCX % 0x100 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
               ,0xcf8,"GGML_ASSERT(%s) failed","n_per_row%QK_K == 0");
  }
  for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
    quantize_row_iq2_xs_impl
              (in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002c8);
  }
  return in_RDX * (in_RCX / 0x100) * 0x4a;
}

Assistant:

size_t quantize_iq2_xs(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq2_xs_impl(src, qrow, n_per_row, quant_weights);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq2_xs);
    }
    return nrow * nblock * sizeof(block_iq2_xs);
}